

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srsw_fifo_s_unittest.cpp
# Opt level: O0

void __thiscall
SRSWFifoSUnitTest_test_size_Test::SRSWFifoSUnitTest_test_size_Test
          (SRSWFifoSUnitTest_test_size_Test *this)

{
  SRSWFifoSUnitTest_test_size_Test *this_local;
  
  SRSWFifoSUnitTest::SRSWFifoSUnitTest(&this->super_SRSWFifoSUnitTest);
  (this->super_SRSWFifoSUnitTest).super_Test._vptr_Test =
       (_func_int **)&PTR__SRSWFifoSUnitTest_test_size_Test_0018b9b8;
  return;
}

Assistant:

TEST_F(SRSWFifoSUnitTest, test_size)
{
    int_fifo f;
    EXPECT_EQ(static_cast<size_t>(0u), f.size());
    f.push(10);
    EXPECT_EQ(1u, f.size());
    f.push(20);
    EXPECT_EQ(2u, f.size());
    f.push(30);
    EXPECT_EQ(3u, f.size());
    f.push(40);
    EXPECT_EQ(3u, f.size());
    f.pop();
    EXPECT_EQ(2u, f.size());
    f.push(40);
    EXPECT_EQ(3u, f.size());
    f.pop();
    EXPECT_EQ(2u, f.size());
    f.pop();
    EXPECT_EQ(1u, f.size());
    f.pop();
    EXPECT_EQ(static_cast<size_t>(0u), f.size());
}